

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

_Bool av1_resize_and_extend_frame_nonnormative
                (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,int bd,int num_planes)

{
  uint length;
  uint length_00;
  int olength;
  uint olength_00;
  int out_stride;
  uint8_t *input;
  uint8_t *output;
  uint uVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  uint16_t *memblk;
  uint16_t *otmp;
  uint16_t *input_00;
  uint16_t *output_00;
  uint16_t *puVar5;
  uint16_t *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  
  uVar1 = 3;
  if (num_planes < 3) {
    uVar1 = num_planes;
  }
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  for (uVar13 = 0; uVar13 != uVar11; uVar13 = uVar13 + 1) {
    lVar7 = (ulong)(uVar13 != 0) * 4;
    input = src->store_buf_adr[uVar13 - 4];
    length = *(uint *)((long)src->store_buf_adr + lVar7 + -0x30);
    length_00 = *(uint *)((long)src->store_buf_adr + lVar7 + -0x38);
    iVar10 = *(int *)((long)src->store_buf_adr + lVar7 + -0x28);
    output = dst->store_buf_adr[uVar13 - 4];
    olength = *(int *)((long)dst->store_buf_adr + lVar7 + -0x30);
    olength_00 = *(uint *)((long)dst->store_buf_adr + lVar7 + -0x38);
    lVar9 = (long)(int)olength_00;
    out_stride = *(int *)((long)dst->store_buf_adr + lVar7 + -0x28);
    if ((src->flags & 8) == 0) {
      _Var2 = av1_resize_plane(input,length,length_00,iVar10,output,olength,olength_00,out_stride);
      if (!_Var2) goto LAB_00338dab;
    }
    else {
      memblk = (uint16_t *)aom_malloc((long)(int)length * 2 * lVar9);
      uVar3 = length;
      if ((int)length < (int)length_00) {
        uVar3 = length_00;
      }
      otmp = (uint16_t *)aom_malloc((long)(int)uVar3 * 2);
      input_00 = (uint16_t *)aom_malloc((long)(int)length * 2);
      output_00 = (uint16_t *)aom_malloc((long)olength * 2);
      auVar16._0_4_ = -(uint)((int)((ulong)memblk >> 0x20) == 0 && (int)memblk == 0);
      auVar16._4_4_ = -(uint)((int)otmp == 0 && (int)((ulong)otmp >> 0x20) == 0);
      auVar16._8_4_ = -(uint)((int)((ulong)input_00 >> 0x20) == 0 && (int)input_00 == 0);
      auVar16._12_4_ = -(uint)((int)output_00 == 0 && (int)((ulong)output_00 >> 0x20) == 0);
      iVar4 = movmskps((int)output_00,auVar16);
      if (iVar4 == 0) {
        uVar14 = 0;
        if (0 < (int)length) {
          uVar14 = (ulong)length;
        }
        puVar5 = (uint16_t *)((long)input * 2);
        puVar6 = memblk;
        uVar12 = uVar14;
        while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
          highbd_resize_multistep(puVar5,length_00,puVar6,olength_00,otmp,bd);
          puVar6 = puVar6 + lVar9;
          puVar5 = puVar5 + iVar10;
        }
        iVar10 = 0;
        if (0 < olength) {
          iVar10 = olength;
        }
        uVar12 = (ulong)olength_00;
        if ((int)olength_00 < 1) {
          uVar12 = 0;
        }
        puVar5 = memblk;
        for (uVar8 = 0; uVar8 != uVar12; uVar8 = uVar8 + 1) {
          puVar6 = puVar5;
          for (lVar7 = 0; (int)uVar14 != (int)lVar7; lVar7 = lVar7 + 1) {
            input_00[lVar7] = *puVar6;
            puVar6 = puVar6 + lVar9;
          }
          highbd_resize_multistep(input_00,length,output_00,olength,otmp,bd);
          puVar6 = (uint16_t *)((long)(output + uVar8) * 2);
          for (lVar7 = 0; iVar10 != (int)lVar7; lVar7 = lVar7 + 1) {
            *puVar6 = output_00[lVar7];
            puVar6 = puVar6 + out_stride;
          }
          puVar5 = puVar5 + 1;
        }
      }
      aom_free(memblk);
      aom_free(otmp);
      aom_free(input_00);
      aom_free(output_00);
    }
  }
  aom_extend_frame_borders_c(dst,num_planes);
LAB_00338dab:
  return (long)(int)uVar1 <= (long)uVar13;
}

Assistant:

bool av1_resize_and_extend_frame_nonnormative(const YV12_BUFFER_CONFIG *src,
                                              YV12_BUFFER_CONFIG *dst, int bd,
                                              int num_planes) {
  // TODO(dkovalev): replace YV12_BUFFER_CONFIG with aom_image_t

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
#if CONFIG_AV1_HIGHBITDEPTH
    if (src->flags & YV12_FLAG_HIGHBITDEPTH) {
      highbd_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                          src->crop_widths[is_uv], src->strides[is_uv],
                          dst->buffers[i], dst->crop_heights[is_uv],
                          dst->crop_widths[is_uv], dst->strides[is_uv], bd);
    } else if (!av1_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                                 src->crop_widths[is_uv], src->strides[is_uv],
                                 dst->buffers[i], dst->crop_heights[is_uv],
                                 dst->crop_widths[is_uv],
                                 dst->strides[is_uv])) {
      return false;
    }
#else
    (void)bd;
    if (!av1_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                          src->crop_widths[is_uv], src->strides[is_uv],
                          dst->buffers[i], dst->crop_heights[is_uv],
                          dst->crop_widths[is_uv], dst->strides[is_uv]))
      return false;
#endif
  }
  aom_extend_frame_borders(dst, num_planes);
  return true;
}